

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall Assimp::Discreet3DSImporter::ParseMainChunk(Discreet3DSImporter *this)

{
  StreamReader<false,_false> *this_00;
  uint uVar1;
  Chunk chunk;
  Chunk local_1e;
  
  if (5 < (uint)(*(int *)&this->stream->limit - *(int *)&this->stream->current)) {
    do {
      ReadChunk(this,&local_1e);
      if ((int)(local_1e.Size - 6) < 1) {
        uVar1 = (int)this->stream->limit - (int)this->stream->current;
      }
      else {
        this_00 = this->stream;
        uVar1 = StreamReader<false,_false>::SetReadLimit
                          (this_00,(local_1e.Size - 6) +
                                   (*(int *)&this_00->current - *(int *)&this_00->buffer));
        if (local_1e.Flag == 0x4d4d) {
LAB_003dbea6:
          ParseEditorChunk(this);
        }
        else if (local_1e.Flag == 0xc23d) {
          this->bIsPrj = true;
          goto LAB_003dbea6;
        }
        this->stream->current = this->stream->limit;
        StreamReader<false,_false>::SetReadLimit(this->stream,uVar1);
        uVar1 = (int)this->stream->limit - (int)this->stream->current;
        if (uVar1 == 0) {
          return;
        }
      }
    } while (5 < uVar1);
  }
  return;
}

Assistant:

void Discreet3DSImporter::ParseMainChunk()
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {

    case Discreet3DS::CHUNK_PRJ:
        bIsPrj = true;
    case Discreet3DS::CHUNK_MAIN:
        ParseEditorChunk();
        break;
    };

    ASSIMP_3DS_END_CHUNK();
    // recursively continue processing this hierarchy level
    return ParseMainChunk();
}